

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

void anon_unknown.dwarf_11e01b::testDoingBadThings(void)

{
  ChannelGroupManifest *pCVar1;
  reference pvVar2;
  ostream *poVar3;
  ArgExc *problem;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  ChannelGroupManifest *idGroup;
  IDManifest mfst;
  int i;
  allocator_type *in_stack_fffffffffffffcc0;
  size_type in_stack_fffffffffffffcc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  ChannelGroupManifest *in_stack_fffffffffffffce0;
  allocator<char> *in_stack_fffffffffffffce8;
  ChannelGroupManifest *in_stack_fffffffffffffcf0;
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [32];
  undefined8 local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  undefined8 local_178;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  allocator<char> local_49;
  string local_48 [32];
  ChannelGroupManifest *local_28;
  IDManifest local_20;
  int local_4;
  
  for (local_4 = 0; local_4 < 7; local_4 = local_4 + 1) {
    Imf_3_4::IDManifest::IDManifest(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
               (allocator<char> *)in_stack_fffffffffffffce0);
    pCVar1 = (ChannelGroupManifest *)Imf_3_4::IDManifest::add((string *)&local_20);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    local_28 = pCVar1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1a46ae);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a46d7);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_78,0);
    std::__cxx11::string::operator=((string *)pvVar2,"model");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_78,1);
    std::__cxx11::string::operator=((string *)pvVar2,"material");
    Imf_3_4::IDManifest::ChannelGroupManifest::setComponents((vector *)local_28);
    pCVar1 = local_28;
    switch(local_4) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
      break;
    case 1:
      pCVar1 = (ChannelGroupManifest *)
               Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_28,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_c8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
      Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_28,2);
      break;
    case 2:
      pCVar1 = (ChannelGroupManifest *)
               Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_28,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      pCVar1 = (ChannelGroupManifest *)
               Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      pCVar1 = (ChannelGroupManifest *)
               Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_118);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_140);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      local_178 = Imf_3_4::IDManifest::ChannelGroupManifest::insert((ulong)pCVar1,(string *)0x2);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      break;
    case 4:
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1a4cd5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a4cfe);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_190,0);
      std::__cxx11::string::operator=((string *)pvVar2,"too");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_190,1);
      std::__cxx11::string::operator=((string *)pvVar2,"many");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_190,2);
      std::__cxx11::string::operator=((string *)pvVar2,"components");
      local_1a0 = Imf_3_4::IDManifest::ChannelGroupManifest::insert((ulong)local_28,(vector *)0x3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffcc0);
      break;
    case 5:
      pCVar1 = (ChannelGroupManifest *)
               Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_28,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      pCVar1 = (ChannelGroupManifest *)
               Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_1c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      in_stack_fffffffffffffcf0 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      Imf_3_4::IDManifest::ChannelGroupManifest::setComponent((string *)in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
      break;
    case 6:
      in_stack_fffffffffffffce8 = &local_239;
      in_stack_fffffffffffffce0 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 (allocator<char> *)in_stack_fffffffffffffce0);
      Imf_3_4::IDManifest::ChannelGroupManifest::insert((string *)in_stack_fffffffffffffce0);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "ERROR: bad usage of IDManifest not detected in test ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4);
    std::operator<<(poVar3,"\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffcc0);
    Imf_3_4::IDManifest::~IDManifest((IDManifest *)0x1a518a);
  }
  return;
}

Assistant:

void
testDoingBadThings ()
{
    for (int i = 0; i <= 6; ++i)
    {
        IDManifest                        mfst;
        IDManifest::ChannelGroupManifest& idGroup = mfst.add ("id");
        vector<string>                    comps (2);
        comps[0] = "model";
        comps[1] = "material";
        idGroup.setComponents (comps);
        try
        {
            switch (i)
            {
                case 0: idGroup << "stringBeforeInt\n"; break;
                case 1:
                    idGroup << 1 << "notEnoughComponentsAdded";
                    idGroup << 2;
                    break;
                case 2:
                    idGroup << 1 << "too "
                            << "many "
                            << "components";
                    break;
                case 3: idGroup.insert (2, "onlyOneComponentInserted"); break;
                case 4: {
                    vector<string> comps (3);
                    comps[0] = "too";
                    comps[1] = "many";
                    comps[2] = "components";
                    idGroup.insert (3, comps);
                    break;
                }
                case 5: {
                    idGroup << 1 << " first "
                            << " entry ";
                    idGroup.setComponent ("changeToJustOne");
                    break;
                }
                case 6: {
                    idGroup.insert ("noHashSchemeSetSoHashMustBeProvided");
                    break;
                }
            }
            std::cerr << "ERROR: bad usage of IDManifest not detected in test "
                      << i << "\n";
            assert (false);
        }
        catch (IEX_NAMESPACE::ArgExc& problem)
        {
            cout << "test " << i << " passed: " << problem.what () << endl;
        }
    }
}